

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmpset.cpp
# Opt level: O0

UChar * __thiscall
icu_63::BMPSet::spanBack(BMPSet *this,UChar *s,UChar *limit,USetSpanCondition spanCondition)

{
  UChar UVar1;
  UChar UVar2;
  char cVar3;
  UBool UVar4;
  uint uVar5;
  int iVar6;
  UChar *pUVar7;
  uint32_t twoBits_1;
  int lead_1;
  uint32_t twoBits;
  int lead;
  UChar c2;
  UChar c;
  USetSpanCondition spanCondition_local;
  UChar *limit_local;
  UChar *s_local;
  BMPSet *this_local;
  
  _c2 = limit;
  if (spanCondition == USET_SPAN_NOT_CONTAINED) {
    do {
      pUVar7 = _c2 + -1;
      UVar1 = _c2[-1];
      if ((ushort)UVar1 < 0x100) {
        cVar3 = this->latin1Contains[(ushort)UVar1];
        goto joined_r0x004b462d;
      }
      if ((ushort)UVar1 < 0x800) {
        uVar5 = this->table7FF[(int)((ushort)UVar1 & 0x3f)] &
                1 << ((byte)((int)(uint)(ushort)UVar1 >> 6) & 0x1f);
joined_r0x004b45fb:
        _c2 = pUVar7;
        if (uVar5 != 0) goto LAB_004b46ed;
      }
      else {
        if (((ushort)UVar1 < 0xd800) || (0xdfff < (ushort)UVar1)) {
          iVar6 = (int)(uint)(ushort)UVar1 >> 0xc;
          uVar5 = this->bmpBlockBits[(int)((int)(uint)(ushort)UVar1 >> 6 & 0x3f)] >> (sbyte)iVar6 &
                  0x10001;
          if (1 < uVar5) {
            cVar3 = containsSlow(this,(uint)(ushort)UVar1,this->list4kStarts[iVar6],
                                 this->list4kStarts[iVar6 + 1]);
            goto joined_r0x004b462d;
          }
          goto joined_r0x004b45fb;
        }
        if (((((ushort)UVar1 < 0xdc00) || (s == pUVar7)) ||
            (UVar2 = _c2[-2], (ushort)UVar2 < 0xd800)) || (0xdbff < (ushort)UVar2)) {
          cVar3 = containsSlow(this,(uint)(ushort)UVar1,this->list4kStarts[0xd],
                               this->list4kStarts[0xe]);
joined_r0x004b462d:
          _c2 = pUVar7;
          if (cVar3 != '\0') goto LAB_004b46ed;
        }
        else {
          UVar4 = containsSlow(this,(uint)(ushort)UVar2 * 0x400 + (uint)(ushort)UVar1 + -0x35fdc00,
                               this->list4kStarts[0x10],this->list4kStarts[0x11]);
          if (UVar4 != '\0') goto LAB_004b46ed;
          _c2 = _c2 + -2;
        }
      }
      if (s == _c2) {
        return s;
      }
    } while( true );
  }
  do {
    pUVar7 = _c2 + -1;
    UVar1 = _c2[-1];
    if ((ushort)UVar1 < 0x100) {
      cVar3 = this->latin1Contains[(ushort)UVar1];
      goto joined_r0x004b4468;
    }
    if ((ushort)UVar1 < 0x800) {
      uVar5 = this->table7FF[(int)((ushort)UVar1 & 0x3f)] &
              1 << ((byte)((int)(uint)(ushort)UVar1 >> 6) & 0x1f);
joined_r0x004b4436:
      _c2 = pUVar7;
      if (uVar5 == 0) goto LAB_004b46ed;
    }
    else {
      if (((ushort)UVar1 < 0xd800) || (0xdfff < (ushort)UVar1)) {
        iVar6 = (int)(uint)(ushort)UVar1 >> 0xc;
        uVar5 = this->bmpBlockBits[(int)((int)(uint)(ushort)UVar1 >> 6 & 0x3f)] >> (sbyte)iVar6 &
                0x10001;
        if (1 < uVar5) {
          cVar3 = containsSlow(this,(uint)(ushort)UVar1,this->list4kStarts[iVar6],
                               this->list4kStarts[iVar6 + 1]);
          goto joined_r0x004b4468;
        }
        goto joined_r0x004b4436;
      }
      if ((((ushort)UVar1 < 0xdc00) || (s == pUVar7)) ||
         ((UVar2 = _c2[-2], (ushort)UVar2 < 0xd800 || (0xdbff < (ushort)UVar2)))) {
        cVar3 = containsSlow(this,(uint)(ushort)UVar1,this->list4kStarts[0xd],
                             this->list4kStarts[0xe]);
joined_r0x004b4468:
        _c2 = pUVar7;
        if (cVar3 == '\0') goto LAB_004b46ed;
      }
      else {
        UVar4 = containsSlow(this,(uint)(ushort)UVar2 * 0x400 + (uint)(ushort)UVar1 + -0x35fdc00,
                             this->list4kStarts[0x10],this->list4kStarts[0x11]);
        if (UVar4 == '\0') {
LAB_004b46ed:
          _c2 = pUVar7;
          return _c2 + 1;
        }
        _c2 = _c2 + -2;
      }
    }
    if (s == _c2) {
      return s;
    }
  } while( true );
}

Assistant:

const UChar *
BMPSet::spanBack(const UChar *s, const UChar *limit, USetSpanCondition spanCondition) const {
    UChar c, c2;

    if(spanCondition) {
        // span
        for(;;) {
            c=*(--limit);
            if(c<=0xff) {
                if(!latin1Contains[c]) {
                    break;
                }
            } else if(c<=0x7ff) {
                if((table7FF[c&0x3f]&((uint32_t)1<<(c>>6)))==0) {
                    break;
                }
            } else if(c<0xd800 || c>=0xe000) {
                int lead=c>>12;
                uint32_t twoBits=(bmpBlockBits[(c>>6)&0x3f]>>lead)&0x10001;
                if(twoBits<=1) {
                    // All 64 code points with the same bits 15..6
                    // are either in the set or not.
                    if(twoBits==0) {
                        break;
                    }
                } else {
                    // Look up the code point in its 4k block of code points.
                    if(!containsSlow(c, list4kStarts[lead], list4kStarts[lead+1])) {
                        break;
                    }
                }
            } else if(c<0xdc00 || s==limit || (c2=*(limit-1))<0xd800 || c2>=0xdc00) {
                // surrogate code point
                if(!containsSlow(c, list4kStarts[0xd], list4kStarts[0xe])) {
                    break;
                }
            } else {
                // surrogate pair
                if(!containsSlow(U16_GET_SUPPLEMENTARY(c2, c), list4kStarts[0x10], list4kStarts[0x11])) {
                    break;
                }
                --limit;
            }
            if(s==limit) {
                return s;
            }
        }
    } else {
        // span not
        for(;;) {
            c=*(--limit);
            if(c<=0xff) {
                if(latin1Contains[c]) {
                    break;
                }
            } else if(c<=0x7ff) {
                if((table7FF[c&0x3f]&((uint32_t)1<<(c>>6)))!=0) {
                    break;
                }
            } else if(c<0xd800 || c>=0xe000) {
                int lead=c>>12;
                uint32_t twoBits=(bmpBlockBits[(c>>6)&0x3f]>>lead)&0x10001;
                if(twoBits<=1) {
                    // All 64 code points with the same bits 15..6
                    // are either in the set or not.
                    if(twoBits!=0) {
                        break;
                    }
                } else {
                    // Look up the code point in its 4k block of code points.
                    if(containsSlow(c, list4kStarts[lead], list4kStarts[lead+1])) {
                        break;
                    }
                }
            } else if(c<0xdc00 || s==limit || (c2=*(limit-1))<0xd800 || c2>=0xdc00) {
                // surrogate code point
                if(containsSlow(c, list4kStarts[0xd], list4kStarts[0xe])) {
                    break;
                }
            } else {
                // surrogate pair
                if(containsSlow(U16_GET_SUPPLEMENTARY(c2, c), list4kStarts[0x10], list4kStarts[0x11])) {
                    break;
                }
                --limit;
            }
            if(s==limit) {
                return s;
            }
        }
    }
    return limit+1;
}